

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_GpuDevice.cpp
# Opt level: O3

void amrex::Gpu::Device::synchronize(void)

{
  return;
}

Assistant:

void
Device::synchronize () noexcept
{
#ifdef AMREX_USE_DPCPP
    auto& q = *(gpu_default_stream.queue);
    try {
        q.wait_and_throw();
    } catch (sycl::exception const& ex) {
        amrex::Abort(std::string("synchronize: ")+ex.what()+"!!!!!");
    }
    for (auto const& s : gpu_stream_pool) {
        try {
            s.queue->wait_and_throw();
        } catch (sycl::exception const& ex) {
            amrex::Abort(std::string("synchronize: ")+ex.what()+"!!!!!");
        }
    }
#else
    AMREX_HIP_OR_CUDA( AMREX_HIP_SAFE_CALL(hipDeviceSynchronize());,
                       AMREX_CUDA_SAFE_CALL(cudaDeviceSynchronize()); )
#endif
}